

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

QByteArray * __thiscall Moc::parsePropertyAccessor(QByteArray *__return_storage_ptr__,Moc *this)

{
  long lVar1;
  Token TVar2;
  int iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  iVar3 = 0;
  while( true ) {
    lVar1 = (this->super_Parser).index;
    TVar2 = NOTOKEN;
    if (lVar1 < (this->super_Parser).symbols.d.size) {
      TVar2 = (this->super_Parser).symbols.d.ptr[lVar1].token;
    }
    if ((iVar3 == 0) && ((TVar2 == PP_RPAREN || (TVar2 == COMMA)))) break;
    TVar2 = Parser::next(&this->super_Parser);
    iVar3 = (iVar3 + (uint)(TVar2 == LPAREN)) - (uint)(TVar2 == PP_RPAREN);
    Parser::lexem((QByteArray *)&local_40,&this->super_Parser);
    QByteArray::append(__return_storage_ptr__,(QByteArray *)&local_40);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray Moc::parsePropertyAccessor()
{
    int nesting = 0;
    QByteArray accessor;
    while (1) {
        Token t = peek();
        if (!nesting && (t == RPAREN || t == COMMA))
            break;
        t = next();
        if (t == LPAREN)
            ++nesting;
        if (t == RPAREN)
            --nesting;
        accessor += lexem();
    }
    return accessor;
}